

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

CPrivKey * __thiscall CKey::GetPrivKey(CKey *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uchar *seckey_00;
  secp256k1_context *ctx;
  uchar *key32;
  CPrivKey *in_RDI;
  long in_FS_OFFSET;
  int ret;
  CPrivKey *seckey;
  size_t seckeylen;
  CKey *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 compressed;
  size_type in_stack_ffffffffffffff90;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> *in_stack_ffffffffffffff98;
  secp256k1_context *this_00;
  
  compressed = (undefined1)((uint)in_stack_ffffffffffffff8c >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      *)in_stack_ffffffffffffff78);
  if (!bVar2) {
    __assert_fail("keydata",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0xaa,"CPrivKey CKey::GetPrivKey() const");
  }
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_ffffffffffffff78);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  this_00 = secp256k1_context_sign;
  seckey_00 = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                         in_stack_ffffffffffffff78);
  ctx = (secp256k1_context *)begin(in_stack_ffffffffffffff78);
  key32 = UCharCast(&in_stack_ffffffffffffff78->fCompressed);
  iVar3 = ec_seckey_export_der(ctx,seckey_00,(size_t *)this_00,key32,(bool)compressed);
  if (iVar3 == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0xb1,"CPrivKey CKey::GetPrivKey() const");
  }
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)this_00,(size_type)key32);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CPrivKey CKey::GetPrivKey() const {
    assert(keydata);
    CPrivKey seckey;
    int ret;
    size_t seckeylen;
    seckey.resize(SIZE);
    seckeylen = SIZE;
    ret = ec_seckey_export_der(secp256k1_context_sign, seckey.data(), &seckeylen, UCharCast(begin()), fCompressed);
    assert(ret);
    seckey.resize(seckeylen);
    return seckey;
}